

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O0

int __thiscall filtered_union_find::link(filtered_union_find *this,char *__from,char *__to)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  const_reference pvVar5;
  byte *pbVar6;
  uint *puVar7;
  index_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  value_type vVar8;
  undefined4 in_stack_ffffffffffffffe4;
  
  uVar2 = find((filtered_union_find *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc);
  uVar3 = find((filtered_union_find *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc);
  puVar7 = (uint *)(ulong)uVar2;
  if (uVar2 == uVar3) goto LAB_001ce403;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                     (&this->filtration,(long)(int)uVar2);
  vVar8 = *pvVar5;
  pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                     (&this->filtration,(long)(int)uVar3);
  if (vVar8 < *pvVar5) {
LAB_001ce370:
    puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               (&this->parent,(long)(int)uVar3);
    *puVar7 = uVar2;
  }
  else {
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&this->filtration,(long)(int)uVar2);
    vVar8 = *pvVar5;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&this->filtration,(long)(int)uVar3);
    if ((vVar8 == *pvVar5) && (!NAN(vVar8) && !NAN(*pvVar5))) {
      pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->rank,(long)(int)uVar2);
      uVar4 = (uint)*pbVar6;
      pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->rank,(long)(int)uVar3);
      if ((int)(uint)*pbVar6 < (int)uVar4) goto LAB_001ce370;
    }
    puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               (&this->parent,(long)(int)uVar2);
    *puVar7 = uVar3;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->rank,(long)(int)uVar2);
    bVar1 = *pbVar6;
    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->rank,(long)(int)uVar3);
    puVar7 = (uint *)(ulong)(uint)bVar1;
    if ((uint)bVar1 == (uint)*pbVar6) {
      puVar7 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 (&this->rank,(long)(int)uVar3);
      *(char *)puVar7 = (char)*puVar7 + '\x01';
    }
  }
LAB_001ce403:
  return (int)puVar7;
}

Assistant:

void link(index_t x, index_t y) {
		x = find(x);
		y = find(y);
		if (x == y) return;
		if (filtration[x] < filtration[y] || (filtration[x] == filtration[y] && rank[x] > rank[y]))
			parent[y] = x;
		else {
			parent[x] = y;
			if (rank[x] == rank[y]) ++rank[y];
		}
	}